

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier_test.cpp
# Opt level: O0

void __thiscall
BarrierTest_ArriveCompletion_Test::~BarrierTest_ArriveCompletion_Test
          (BarrierTest_ArriveCompletion_Test *this)

{
  BarrierTest_ArriveCompletion_Test *this_local;
  
  ~BarrierTest_ArriveCompletion_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(BarrierTest, ArriveCompletion)
{
  int counter = 0;
  counting_completion complation{&counter};
  yamc::barrier<counting_completion> barrier{2, complation};  // expected count=2
  EXPECT_NO_THROW((void)barrier.arrive());   // c=2->1
  EXPECT_EQ(counter, 0);
  EXPECT_NO_THROW((void)barrier.arrive());   // c=1->0, call completion
  EXPECT_EQ(counter, 1);
  EXPECT_NO_THROW((void)barrier.arrive(2));  // c=2->0, call completion
  EXPECT_EQ(counter, 2);
}